

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,string *decoded)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  string *in_RDX;
  long in_RSI;
  uint unicode;
  Char escape;
  Char c;
  Location end;
  Location current;
  allocator local_b9;
  string local_b8 [32];
  Location in_stack_ffffffffffffff68;
  Token *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  Reader *in_stack_ffffffffffffff80;
  uint *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Location *in_stack_ffffffffffffff98;
  Token *in_stack_ffffffffffffffa0;
  Reader *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffcc;
  char *local_28;
  
  std::__cxx11::string::reserve((ulong)in_RDX);
  pcVar3 = (char *)(*(long *)(in_RSI + 0x10) + -1);
  local_28 = (char *)(*(long *)(in_RSI + 8) + 1);
  while( true ) {
    if (local_28 == pcVar3) {
      return true;
    }
    pcVar4 = local_28 + 1;
    cVar1 = *local_28;
    in_stack_ffffffffffffffcc = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffcc);
    if (cVar1 == '\"') break;
    if (cVar1 == '\\') {
      if (pcVar4 == pcVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffa8,"Empty escape sequence in string",
                   (allocator *)&stack0xffffffffffffffa7);
        bVar2 = addError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
        return bVar2;
      }
      local_28 = local_28 + 2;
      in_stack_ffffffffffffff90 = CONCAT13(*pcVar4,(int3)in_stack_ffffffffffffff90);
      switch(*pcVar4) {
      case '\"':
        std::__cxx11::string::operator+=(in_RDX,'\"');
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"Bad escape sequence in string",&local_b9);
        bVar2 = addError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        return bVar2;
      case '/':
        std::__cxx11::string::operator+=(in_RDX,'/');
        break;
      case '\\':
        std::__cxx11::string::operator+=(in_RDX,'\\');
        break;
      case 'b':
        std::__cxx11::string::operator+=(in_RDX,'\b');
        break;
      case 'f':
        std::__cxx11::string::operator+=(in_RDX,'\f');
        break;
      case 'n':
        std::__cxx11::string::operator+=(in_RDX,'\n');
        break;
      case 'r':
        std::__cxx11::string::operator+=(in_RDX,'\r');
        break;
      case 't':
        std::__cxx11::string::operator+=(in_RDX,'\t');
        break;
      case 'u':
        bVar2 = decodeUnicodeCodePoint
                          (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff98,
                           (Location)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        if (!bVar2) {
          return false;
        }
        codePointToUTF8_abi_cxx11_(in_stack_ffffffffffffffcc);
        std::__cxx11::string::operator+=(in_RDX,(string *)&stack0xffffffffffffff68);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      }
    }
    else {
      std::__cxx11::string::operator+=(in_RDX,cVar1);
      local_28 = pcVar4;
    }
  }
  return true;
}

Assistant:

bool Reader::decodeString(Token& token, std::string& decoded) {
  decoded.reserve(token.end_ - token.start_ - 2);
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}